

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O1

DSeqNode * SN_CheckSequence(sector_t *sector,int chan)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  DSeqNode *unaff_R12;
  DSeqNode *pDVar4;
  DSeqNode *pDVar5;
  bool bVar6;
  
  pDVar4 = DSeqNode::SequenceListHead;
  do {
    if (pDVar4 == (DSeqNode *)0x0) {
      return (DSeqNode *)0x0;
    }
    pDVar5 = pDVar4->m_Next;
    iVar2 = (*(pDVar4->super_DObject)._vptr_DObject[8])(pDVar4);
    pPVar1 = DSeqSectorNode::RegistrationInfo.MyClass;
    if ((sector_t *)CONCAT44(extraout_var,iVar2) == sector) {
      if ((pDVar4->super_DObject).Class == (PClass *)0x0) {
        iVar2 = (**(pDVar4->super_DObject)._vptr_DObject)(pDVar4);
        (pDVar4->super_DObject).Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
      }
      pPVar3 = (pDVar4->super_DObject).Class;
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar1 && bVar6) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar6 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar1) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (!bVar6) {
        __assert_fail("node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sndseq.cpp"
                      ,0x3e0,"DSeqNode *SN_CheckSequence(sector_t *, int)");
      }
      if ((*(uint *)&pDVar4[1].super_DObject._vptr_DObject & 7) != chan) goto LAB_002f8dc0;
      bVar6 = false;
      unaff_R12 = pDVar4;
      pDVar5 = pDVar4;
    }
    else {
LAB_002f8dc0:
      bVar6 = true;
    }
    pDVar4 = pDVar5;
    if (!bVar6) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

DSeqNode *SN_CheckSequence(sector_t *sector, int chan)
{
	for (DSeqNode *node = DSeqNode::FirstSequence(); node; )
	{
		DSeqNode *next = node->NextSequence();
		if (node->Source() == sector)
		{
			assert(node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode)));
			if ((static_cast<DSeqSectorNode *>(node)->Channel & 7) == chan)
			{
				return node;
			}
		}
		node = next;
	}
	return NULL;
}